

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall cppcms::json::value::at(value *this,char *cpath,value *v)

{
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  value *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_value>_>::value,_pair<iterator,_bool>_>
  _Var4;
  iterator p;
  object *obj;
  string_key part;
  size_t new_pos;
  size_t pos;
  value *ptr;
  string_key path;
  string_key *in_stack_fffffffffffffdf8;
  string_key *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  _Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
  in_stack_fffffffffffffe10;
  string_key *in_stack_fffffffffffffe18;
  iterator in_stack_fffffffffffffe20;
  string_key *in_stack_fffffffffffffe28;
  undefined8 *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  json_type in_stack_fffffffffffffe3c;
  string local_180 [72];
  _Base_ptr local_138;
  undefined1 local_130;
  _Self local_128;
  _Base_ptr local_120;
  _Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_> local_118;
  string_key *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [96];
  string_key *local_60;
  string_key *local_58;
  value *local_50;
  
  string_key::unowned((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  local_58 = (string_key *)0x0;
  local_50 = in_RDI;
  do {
    local_60 = (string_key *)
               string_key::find(in_stack_fffffffffffffe28,
                                (char)((ulong)in_stack_fffffffffffffe20._M_node >> 0x38),
                                (size_t)in_stack_fffffffffffffe18);
    string_key::unowned_substr
              ((string_key *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (size_t)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
    if (local_60 != (string_key *)0xffffffffffffffff) {
      local_60 = (string_key *)&(((_Rep_type *)&local_60->begin_)->_M_impl).field_0x1;
    }
    bVar1 = string_key::empty(in_stack_fffffffffffffe00);
    if (bVar1) {
      local_c2 = 1;
      uVar2 = __cxa_allocate_exception(0x48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"Invalid path provided",&local_c1);
      bad_value_cast::bad_value_cast
                ((bad_value_cast *)in_stack_fffffffffffffe10._M_node,
                 (string *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      local_c2 = 0;
      __cxa_throw(uVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    in_stack_fffffffffffffe3c = type((value *)0x3e412e);
    if (in_stack_fffffffffffffe3c != is_object) {
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      in_stack_fffffffffffffe30 = &local_108;
      std::
      map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
      ::map((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
             *)0x3e416e);
      value<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                ((value *)in_stack_fffffffffffffe10._M_node,
                 (map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      operator=((value *)in_stack_fffffffffffffe00,(value *)in_stack_fffffffffffffdf8);
      ~value((value *)0x3e41a6);
      std::
      map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
      ::~map((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
              *)0x3e41b3);
    }
    in_stack_fffffffffffffe28 = (string_key *)object((value *)0x3e420b);
    local_110 = in_stack_fffffffffffffe28;
    std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
    _Rb_tree_iterator(&local_118);
    in_stack_fffffffffffffe20 =
         std::
         map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
         ::find((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                 *)in_stack_fffffffffffffdf8,(key_type *)0x3e4241);
    local_120 = in_stack_fffffffffffffe20._M_node;
    local_118._M_node = in_stack_fffffffffffffe20._M_node;
    local_128._M_node =
         (_Base_ptr)
         std::
         map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
         ::end((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                *)in_stack_fffffffffffffdf8);
    bVar1 = std::operator==(&local_118,&local_128);
    if (bVar1) {
      in_stack_fffffffffffffe18 = local_110;
      string_key::str_abi_cxx11_
                ((string_key *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      value((value *)0x3e42c9);
      std::make_pair<std::__cxx11::string,cppcms::json::value>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                 (value *)in_stack_fffffffffffffe00);
      _Var4 = std::
              map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
              ::insert<std::pair<std::__cxx11::string,cppcms::json::value>>
                        ((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                          *)in_stack_fffffffffffffe10._M_node,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
                          *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      in_stack_fffffffffffffe10 = _Var4.first._M_node;
      in_stack_fffffffffffffe0f = _Var4.second;
      local_138 = in_stack_fffffffffffffe10._M_node;
      local_130 = in_stack_fffffffffffffe0f;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
               operator->((_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
                           *)0x3e433e);
      local_50 = &ppVar3->second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
               *)in_stack_fffffffffffffe00);
      ~value((value *)0x3e4364);
      std::__cxx11::string::~string(local_180);
    }
    else {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
               operator->((_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
                           *)0x3e43ef);
      local_50 = &ppVar3->second;
    }
    local_58 = local_60;
    string_key::~string_key((string_key *)0x3e4418);
    in_stack_fffffffffffffdf8 = local_60;
    in_stack_fffffffffffffe00 = (string_key *)string_key::size(in_stack_fffffffffffffe00);
  } while (in_stack_fffffffffffffdf8 < in_stack_fffffffffffffe00);
  operator=((value *)in_stack_fffffffffffffe00,(value *)in_stack_fffffffffffffdf8);
  string_key::~string_key((string_key *)0x3e446e);
  return;
}

Assistant:

void value::at(char const *cpath,value const &v)
	{
		string_key path=string_key::unowned(cpath);
		value *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key part=path.unowned_substr(pos,new_pos - pos);


			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				throw bad_value_cast("Invalid path provided");
			if(ptr->type()!=json::is_object) {
				*ptr=json::object();
			}
			json::object &obj=ptr->object();
			json::object::iterator p;
			if((p=obj.find(part))==obj.end()) {
				ptr=&obj.insert(std::make_pair(part.str(),json::value())).first->second;
			}
			else
				ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		*ptr=v;
	}